

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O1

pair<slang::syntax::PragmaExpressionSyntax_*,_bool> __thiscall
slang::parsing::Preprocessor::parsePragmaExpression(Preprocessor *this)

{
  bool bVar1;
  NameValuePragmaExpressionSyntax *pNVar2;
  undefined8 unaff_RBP;
  ulong uVar3;
  Token TVar4;
  pair<slang::syntax::PragmaExpressionSyntax_*,_bool> pVar5;
  Token name;
  Token equals;
  Token local_38;
  Token local_28;
  
  TVar4 = peek(this);
  if (TVar4.kind != Identifier) {
    bVar1 = LexerFacts::isKeyword(TVar4.kind);
    if (!bVar1) {
      pVar5 = parsePragmaValue(this);
      pNVar2 = (NameValuePragmaExpressionSyntax *)pVar5.first;
      uVar3 = (ulong)pVar5._8_4_;
      goto LAB_002109da;
    }
  }
  local_38 = consume(this);
  bVar1 = peekSameLine(this);
  if (bVar1) {
    TVar4 = peek(this);
    if (TVar4.kind == Equals) {
      local_28 = consume(this);
      pVar5 = parsePragmaValue(this);
      uVar3 = (ulong)pVar5._8_4_;
      pNVar2 = BumpAllocator::
               emplace<slang::syntax::NameValuePragmaExpressionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::PragmaExpressionSyntax&>
                         (this->alloc,&local_38,&local_28,pVar5.first);
      goto LAB_002109da;
    }
  }
  pNVar2 = (NameValuePragmaExpressionSyntax *)
           BumpAllocator::
           emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token&>
                     (this->alloc,&local_38);
  uVar3 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
LAB_002109da:
  pVar5._8_8_ = uVar3 & 0xffffffff;
  pVar5.first = &pNVar2->super_PragmaExpressionSyntax;
  return pVar5;
}

Assistant:

std::pair<PragmaExpressionSyntax*, bool> Preprocessor::parsePragmaExpression() {
    Token token = peek();
    if (token.kind == TokenKind::Identifier || LexerFacts::isKeyword(token.kind)) {
        auto name = consume();
        if (peekSameLine() && peek().kind == TokenKind::Equals) {
            auto equals = consume();
            auto [expr, succeeded] = parsePragmaValue();
            auto result = alloc.emplace<NameValuePragmaExpressionSyntax>(name, equals, *expr);
            return {result, succeeded};
        }

        return {alloc.emplace<SimplePragmaExpressionSyntax>(name), true};
    }

    return parsePragmaValue();
}